

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O1

t_int * sighip_perform(t_int *w)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  t_bigorsmall32 pun;
  float fVar7;
  float fVar8;
  
  lVar1 = w[1];
  lVar2 = w[2];
  pfVar3 = (float *)w[3];
  fVar6 = pfVar3[1];
  iVar4 = (int)w[4];
  if (1.0 <= fVar6) {
    fVar6 = 0.0;
    if (0 < iVar4) {
      lVar5 = 0;
      do {
        *(undefined4 *)(lVar2 + lVar5 * 4) = *(undefined4 *)(lVar1 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (iVar4 != (int)lVar5);
    }
  }
  else {
    fVar7 = *pfVar3;
    if (0 < iVar4) {
      lVar5 = 0;
      fVar8 = fVar7;
      do {
        fVar7 = fVar6 * fVar8 + *(float *)(lVar1 + lVar5 * 4);
        *(float *)(lVar2 + lVar5 * 4) = (fVar7 - fVar8) * (fVar6 + 1.0) * 0.5;
        lVar5 = lVar5 + 1;
        fVar8 = fVar7;
      } while (iVar4 != (int)lVar5);
    }
    fVar6 = 0.0;
    if ((((uint)fVar7 >> 0x1d ^ (uint)fVar7 >> 0x1e) & 1) != 0) {
      fVar6 = fVar7;
    }
  }
  *pfVar3 = fVar6;
  return w + 5;
}

Assistant:

static t_int *sighip_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_hipctl *c = (t_hipctl *)(w[3]);
    int n = (int)w[4];
    int i;
    t_sample last = c->c_x;
    t_sample coef = c->c_coef;
    if (coef < 1)
    {
        t_sample normal = 0.5*(1+coef);
        for (i = 0; i < n; i++)
        {
            t_sample new = *in++ + coef * last;
            *out++ = normal * (new - last);
            last = new;
        }
        if (PD_BIGORSMALL(last))
            last = 0;
        c->c_x = last;
    }
    else
    {
        for (i = 0; i < n; i++)
            *out++ = *in++;
        c->c_x = 0;
    }
    return (w+5);
}